

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O3

string * __thiscall
zmq::socket_base_t::resolve_tcp_addr
          (string *__return_storage_ptr__,socket_base_t *this,string *endpoint_uri_pair_,
          char *tcp_address_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  iterator iVar5;
  tcp_address_t *this_00;
  iterator iVar6;
  
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
          ::find(&(this->_endpoints)._M_t,endpoint_uri_pair_);
  if ((_Rb_tree_header *)iVar5._M_node == &(this->_endpoints)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (tcp_address_t *)operator_new(0x3c,(nothrow_t *)&std::nothrow);
    if (this_00 == (tcp_address_t *)0x0) {
      resolve_tcp_addr();
    }
    else {
      tcp_address_t::tcp_address_t(this_00);
    }
    iVar4 = tcp_address_t::resolve(this_00,tcp_address_,false,(this->super_own_t).options.ipv6);
    if (iVar4 == 0) {
      tcp_address_t::to_string(this_00,endpoint_uri_pair_);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
              ::find(&(this->_endpoints)._M_t,endpoint_uri_pair_);
      if (iVar6._M_node == iVar5._M_node) {
        iVar4 = tcp_address_t::resolve(this_00,tcp_address_,true,(this->super_own_t).options.ipv6);
        if (iVar4 == 0) {
          tcp_address_t::to_string(this_00,endpoint_uri_pair_);
        }
      }
    }
    operator_delete(this_00,0x3c);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (endpoint_uri_pair_->_M_dataplus)._M_p;
  paVar1 = &endpoint_uri_pair_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&endpoint_uri_pair_->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = endpoint_uri_pair_->_M_string_length;
  (endpoint_uri_pair_->_M_dataplus)._M_p = (pointer)paVar1;
  endpoint_uri_pair_->_M_string_length = 0;
  (endpoint_uri_pair_->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string
zmq::socket_base_t::resolve_tcp_addr (std::string endpoint_uri_pair_,
                                      const char *tcp_address_)
{
    // The resolved last_endpoint is used as a key in the endpoints map.
    // The address passed by the user might not match in the TCP case due to
    // IPv4-in-IPv6 mapping (EG: tcp://[::ffff:127.0.0.1]:9999), so try to
    // resolve before giving up. Given at this stage we don't know whether a
    // socket is connected or bound, try with both.
    if (_endpoints.find (endpoint_uri_pair_) == _endpoints.end ()) {
        tcp_address_t *tcp_addr = new (std::nothrow) tcp_address_t ();
        alloc_assert (tcp_addr);
        int rc = tcp_addr->resolve (tcp_address_, false, options.ipv6);

        if (rc == 0) {
            tcp_addr->to_string (endpoint_uri_pair_);
            if (_endpoints.find (endpoint_uri_pair_) == _endpoints.end ()) {
                rc = tcp_addr->resolve (tcp_address_, true, options.ipv6);
                if (rc == 0) {
                    tcp_addr->to_string (endpoint_uri_pair_);
                }
            }
        }
        LIBZMQ_DELETE (tcp_addr);
    }
    return endpoint_uri_pair_;
}